

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autobondrot.c
# Opt level: O1

void autobondrot(FILE *outf,xformDatabase *xdb,abrProbeProc *probeProc,void *probestuff,
                abrAtomListProc *delAtomProc,void *deletestuff,int dumpGoToAtoms)

{
  transformData *ptVar1;
  bool bVar2;
  atom *paVar3;
  int iVar4;
  uint uVar5;
  goToRec_t *pgVar6;
  long lVar7;
  uint uVar8;
  double dVar9;
  
  if (xdb != (xformDatabase *)0x0) {
    pgVar6 = xdb->golist;
    if (pgVar6 == (goToRec *)0x0) {
      iVar4 = xdb->nlevs;
      if (0 < iVar4) {
        lVar7 = 0;
        do {
          ptVar1 = xdb->level[lVar7];
          ptVar1->currVal = ptVar1->startVal;
          rebuildTmat(ptVar1);
          lVar7 = lVar7 + 1;
          iVar4 = xdb->nlevs;
        } while (lVar7 < iVar4);
      }
      if (0 < iVar4) {
        uVar5 = iVar4 - 1;
        bVar2 = false;
        do {
          uVar8 = uVar5;
          if (!bVar2) {
            do {
              paVar3 = orientedAtoms(xdb);
              dVar9 = runnameAndTorsion(xdb,XFworkBuf,300);
              (*probeProc)(XFworkBuf,dVar9,paVar3,probestuff);
              cleanupListExtras(paVar3,xdb,delAtomProc,deletestuff);
              iVar4 = xdb->nlevs;
              ptVar1 = xdb->level[(long)iVar4 + -1];
              ptVar1->currVal = ptVar1->stepVal + ptVar1->currVal;
              rebuildTmat(ptVar1);
              bVar2 = ptVar1->currVal < ptVar1->endVal + -1e-05;
              if (0.0 < ptVar1->stepVal) {
                bVar2 = ptVar1->endVal + 1e-05 < ptVar1->currVal;
              }
            } while (!bVar2);
            uVar8 = iVar4 - 1;
          }
          ptVar1 = xdb->level[(int)uVar8];
          ptVar1->currVal = ptVar1->startVal;
          rebuildTmat(ptVar1);
          uVar5 = uVar8 - 1;
          if ((int)uVar8 < 1) {
            bVar2 = false;
          }
          else {
            ptVar1 = xdb->level[uVar5];
            ptVar1->currVal = ptVar1->stepVal + ptVar1->currVal;
            rebuildTmat(ptVar1);
            bVar2 = ptVar1->currVal < ptVar1->endVal + -1e-05;
            if (0.0 < ptVar1->stepVal) {
              bVar2 = ptVar1->endVal + 1e-05 < ptVar1->currVal;
            }
          }
        } while (0 < (int)uVar8);
      }
    }
    else {
      do {
        if (0 < xdb->nlevs) {
          lVar7 = 0;
          do {
            ptVar1 = xdb->level[lVar7];
            ptVar1->currVal = pgVar6->level[lVar7];
            rebuildTmat(ptVar1);
            lVar7 = lVar7 + 1;
          } while (lVar7 < xdb->nlevs);
        }
        paVar3 = orientedAtoms(xdb);
        dVar9 = runnameAndTorsion(xdb,XFworkBuf,300);
        if (dumpGoToAtoms != 0) {
          fprintf((FILE *)outf,"REMARK Atoms Rotated To %s\n",XFworkBuf);
          XFdescribeAtomList(outf,paVar3);
        }
        (*probeProc)(XFworkBuf,dVar9,paVar3,probestuff);
        cleanupListExtras(paVar3,xdb,delAtomProc,deletestuff);
        pgVar6 = pgVar6->next;
      } while (pgVar6 != (goToRec_t *)0x0);
    }
  }
  return;
}

Assistant:

void autobondrot(FILE *outf, xformDatabase* xdb,
	       abrProbeProc    probeProc,   void *probestuff,
	       abrAtomListProc delAtomProc, void *deletestuff,
	       int dumpGoToAtoms) 
{/*autobondrot()*/
/*where:  (see probe/autobondrot(...); )
   outf  == stderr
   xdb   == xdb
   probeProc == movingDoCommand
   probestuff == mcis
   delAtomProc == deleteMovingAtom
   deletestuff == mabis
   dumpGoToAtoms == Verbose
*/

   int overflow = FALSE, cursor = 0;
   transformData* xform = NULL;
   goToRec* g = NULL;
   atom* alst = NULL;
   double torsionScore = 0.0;

   if (xdb)
   {
      if (xdb->golist)  /*working from a list of GO statements */
      {/*if using GO statements: specific orientations requested */
         for(g = xdb->golist; g; g = g->next) 
         {
            setOrientation(xdb, g);

            alst = orientedAtoms(xdb); /* atom* alst == atom *allMovingAtoms */
	    torsionScore = runnameAndTorsion(xdb, XFworkBuf, MAX_XF_REC_LEN);

            /*torsionScore is NOT a score, holds angle-bias to modify score*/

	    if (dumpGoToAtoms) 
            {
	       fprintf(outf, "REMARK Atoms Rotated To %s\n", XFworkBuf);
	       XFdescribeAtomList(outf, alst);
	    }

            probeProc(XFworkBuf, torsionScore, alst, probestuff); 
               /* process the oriented atoms */
               /*probeProc == movingDoCommand() which calls doCommand()*/
               /*where: (see probe.c/movingDoCommand() )
                    XFworkBuf == char* orientationName  holds angle values
                    torsionScore == double scoreBias
                    alst == atom *allMovingAtoms existance implies autobondrot
                    probestuff == void *userdata == mcis
               */

            cleanupListExtras(alst, xdb, delAtomProc, deletestuff);
         }
         return; /* can quit when we are done with the 'go to's */
      }/*if using GO statements: specific orientations requested */

      /*else: working from intermixed atoms and transformations */

      /* initialize transformation values */
      for(cursor=0; cursor < xdb->nlevs; cursor++) {
         xform = xdb->level[cursor];
         xform->currVal = xform->startVal;
         rebuildTmat(xform);
      }

#define ABR_COMP_EPSILON 0.00001

      overflow = FALSE;
      cursor = xdb->nlevs - 1;
      while(cursor >= 0) 
      {
         while(! overflow) 
         {

            alst = orientedAtoms(xdb); /* atom* alst == atom *allMovingAtoms */
	    torsionScore = runnameAndTorsion(xdb, XFworkBuf, MAX_XF_REC_LEN);

            /*torsionScore is NOT a score, holds angle-bias to modify score*/

            probeProc(XFworkBuf, torsionScore, alst, probestuff); 
               /* process the oriented atoms */
               /*probeProc == movingDoCommand() which calls doCommand()*/
               /*where: (see probe.c/movingDoCommand() )
                    XFworkBuf == char* orientationName  holds angle values
                    torsionScore == double scoreBias
                    alst == atom *allMovingAtoms existance implies autobondrot
                    probestuff == void *userdata == mcis
               */
 
            cleanupListExtras(alst, xdb, delAtomProc, deletestuff);

            cursor = xdb->nlevs - 1;
            xform = xdb->level[cursor];
            xform->currVal += xform->stepVal;
            rebuildTmat(xform);
            overflow = (xform->stepVal > 0)
                       ?  (xform->currVal > (xform->endVal + ABR_COMP_EPSILON))
                       :  (xform->currVal < (xform->endVal - ABR_COMP_EPSILON));
         }

         xform = xdb->level[cursor];
         xform->currVal = xform->startVal;
         rebuildTmat(xform);

         overflow = FALSE;

         if (--cursor >= 0) 
         {
            xform = xdb->level[cursor];
            xform->currVal += xform->stepVal;
            rebuildTmat(xform);
            overflow = (xform->stepVal > 0)
                      ?  (xform->currVal > (xform->endVal + ABR_COMP_EPSILON))
                      :  (xform->currVal < (xform->endVal - ABR_COMP_EPSILON));
         }
      }
   }
}